

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O0

deUint32 vkt::image::getLayerDimensions(ImageType imageType)

{
  deUint32 local_c;
  ImageType imageType_local;
  
  if (imageType < IMAGE_TYPE_2D) {
LAB_00d29872:
    local_c = 1;
  }
  else {
    if (1 < imageType - IMAGE_TYPE_2D) {
      if (imageType == IMAGE_TYPE_3D) {
        return 3;
      }
      if (1 < imageType - IMAGE_TYPE_CUBE) {
        if (imageType != IMAGE_TYPE_BUFFER) {
          return 0;
        }
        goto LAB_00d29872;
      }
    }
    local_c = 2;
  }
  return local_c;
}

Assistant:

deUint32 getLayerDimensions (const ImageType imageType)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
		case IMAGE_TYPE_1D_ARRAY:
			return 1u;

		case IMAGE_TYPE_2D:
		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_CUBE:
		case IMAGE_TYPE_CUBE_ARRAY:
			return 2u;

		case IMAGE_TYPE_3D:
			return 3u;

		default:
			DE_FATAL("Unknown image type");
			return 0u;
	}
}